

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exttpose.cc
# Opt level: O3

void __thiscall Exttpose::do_invert_db(Exttpose *this,int pblk,int mincustid,int maxcustid)

{
  DbaseCtrlBlk *this_00;
  char cVar1;
  pointer pTVar2;
  pointer piVar3;
  int fd;
  ExttposeArgument *pEVar4;
  unsigned_long uVar5;
  ostream *this_01;
  long *plVar6;
  int *piVar7;
  runtime_error *this_02;
  undefined4 in_register_0000000c;
  long lVar8;
  undefined4 in_register_00000034;
  uint custid_00;
  long lVar9;
  ostringstream *poVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int custid;
  int tid;
  int numitem;
  int *buf;
  string tmpnam;
  ostringstream tmpname;
  int local_230;
  uint local_22c;
  int local_228;
  int local_224;
  uint local_220;
  int local_21c;
  int *local_218;
  uint local_20c;
  int local_208;
  int local_204;
  undefined8 local_200;
  undefined8 local_1f8;
  DbaseCtrlBlk *local_1f0;
  undefined1 *local_1e8;
  undefined8 local_1e0;
  undefined1 local_1d8 [16];
  char *local_1c8;
  char local_1b8 [16];
  ostringstream local_1a8 [8];
  string local_1a0 [104];
  ios_base local_138 [264];
  
  local_1f8 = CONCAT44(in_register_00000034,pblk);
  local_200 = CONCAT44(in_register_0000000c,maxcustid);
  local_224 = 0;
  local_228 = 0;
  local_22c = 0;
  local_218 = (int *)0x0;
  local_204 = mincustid;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  this_00 = &this->dcb;
  DbaseCtrlBlk::get_first_blk(this_00);
  DbaseCtrlBlk::get_next_trans(this_00,&local_218,&local_224,&local_228,(int *)&local_22c);
  pEVar4 = this->args;
  if (0 < pEVar4->num_partitions) {
    local_208 = (int)local_200 + 1;
    local_230 = 0;
    local_1f0 = this_00;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(pEVar4->output)._M_dataplus._M_p,
                 (pEVar4->output)._M_string_length);
      if (1 < this->args->num_partitions) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".P",2);
        std::ostream::operator<<((ostream *)local_1a8,local_230);
      }
      std::__cxx11::stringbuf::str();
      local_1e0 = 0;
      local_1d8[0] = 0;
      local_1e8 = local_1d8;
      std::__cxx11::stringbuf::str(local_1a0);
      if (local_1e8 != local_1d8) {
        operator_delete(local_1e8);
      }
      fd = open(local_1c8,0x241,0x1b6);
      if (fd < 0) {
        this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_02,"Can\'t open out file");
        __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar5 = this->numfreq;
      if (uVar5 != 0) {
        piVar7 = &((this->extary).super__Vector_base<TransArray,_std::allocator<TransArray>_>.
                   _M_impl.super__Vector_impl_data._M_start)->theSize;
        do {
          *(undefined8 *)(piVar7 + -1) = 0;
          *(char *)(piVar7 + -2) = '\0';
          piVar7 = piVar7 + 0x12;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      iVar12 = local_230 * (int)local_1f8 + local_204;
      local_21c = (int)local_1f8 + iVar12;
      if ((int)local_200 <= local_21c) {
        local_21c = local_208;
      }
      poVar10 = &this->env->logger;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,"BOUNDS ",7);
      this_01 = (ostream *)std::ostream::operator<<((ostream *)poVar10,iVar12);
      std::__ostream_insert<char,std::char_traits<char>>(this_01," ",1);
      plVar6 = (long *)std::ostream::operator<<((ostream *)this_01,local_21c);
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
      std::ostream::put((char)plVar6);
      std::ostream::flush();
      cVar1 = (this->dcb).readall;
      while ((cVar1 != '\x01' && (local_20c = local_22c, (int)local_22c < local_21c))) {
        local_220 = 0;
        while (cVar1 = (this->dcb).readall, cVar1 != '\x01') {
          pEVar4 = this->args;
          if ((local_20c != local_22c) || (local_21c <= (int)local_22c)) goto LAB_001096b6;
          if (pEVar4->use_diff == '\0') {
            if (0 < local_224) {
              lVar9 = 0;
              do {
                iVar12 = (this->freqidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[local_218[lVar9]];
                lVar8 = (long)iVar12;
                if (lVar8 != -1) {
                  pEVar4 = this->args;
                  if (pEVar4->use_newformat == '\0') {
                    iVar13 = pEVar4->use_seq;
                    pTVar2 = (this->extary).
                             super__Vector_base<TransArray,_std::allocator<TransArray>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    if ((iVar13 != 0) && (pTVar2[lVar8].theFlg == '\0')) {
                      (this->fidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[(int)local_220] = iVar12;
                      pTVar2[lVar8].theFlg = '\x01';
                      TransArray::add(pTVar2 + lVar8,fd,local_228,pEVar4->use_seq,local_230,
                                      local_22c);
                      local_220 = local_220 + 1;
                      goto LAB_00109643;
                    }
                    custid_00 = 0xffffffff;
                  }
                  else {
                    pTVar2 = (this->extary).
                             super__Vector_base<TransArray,_std::allocator<TransArray>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    iVar13 = pEVar4->use_seq;
                    custid_00 = local_22c;
                  }
                  TransArray::add(pTVar2 + lVar8,fd,local_228,iVar13,local_230,custid_00);
                }
LAB_00109643:
                lVar9 = lVar9 + 1;
              } while (lVar9 < local_224);
            }
          }
          else {
            uVar11 = 0;
            if (0 < local_224) {
              iVar13 = 0;
              piVar7 = local_218;
              iVar12 = local_224;
              do {
                if ((this->freqidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[piVar7[uVar11]] != -1) {
                  lVar9 = (long)iVar13;
                  if ((this->backidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar9] < piVar7[uVar11]) {
                    lVar8 = lVar9 * 0x48;
                    do {
                      lVar9 = lVar9 + 1;
                      TransArray::add((TransArray *)
                                      ((long)&(((this->extary).
                                                super__Vector_base<TransArray,_std::allocator<TransArray>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->theArray
                                              ).super__Vector_base<int,_std::allocator<int>_>.
                                              _M_impl + lVar8),fd,local_228,this->args->use_seq,
                                      local_230,
                                      -(uint)(this->args->use_newformat == '\0') | local_22c);
                      lVar8 = lVar8 + 0x48;
                      iVar13 = iVar13 + 1;
                      piVar7 = local_218;
                      iVar12 = local_224;
                    } while ((this->backidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar9] < local_218[uVar11]);
                  }
                  iVar13 = iVar13 + 1;
                }
                uVar11 = uVar11 + 1;
              } while ((long)uVar11 < (long)iVar12);
              uVar11 = (ulong)iVar13;
            }
            if (uVar11 < this->numfreq) {
              lVar9 = uVar11 * 0x48;
              do {
                TransArray::add((TransArray *)
                                ((long)&(((this->extary).
                                          super__Vector_base<TransArray,_std::allocator<TransArray>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->theArray).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                lVar9),fd,local_228,this->args->use_seq,local_230,
                                -(uint)(this->args->use_newformat == '\0') | local_22c);
                uVar11 = uVar11 + 1;
                lVar9 = lVar9 + 0x48;
              } while (uVar11 < this->numfreq);
            }
          }
          DbaseCtrlBlk::get_next_trans(local_1f0,&local_218,&local_224,&local_228,(int *)&local_22c)
          ;
        }
        pEVar4 = this->args;
LAB_001096b6:
        if (((pEVar4->use_newformat == '\0') && (pEVar4->use_seq != 0)) && (0 < (int)local_220)) {
          pTVar2 = (this->extary).super__Vector_base<TransArray,_std::allocator<TransArray>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          piVar3 = (this->fidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar11 = 0;
          do {
            iVar12 = piVar3[uVar11];
            *(int *)(*(long *)&pTVar2[iVar12].theArray.super__Vector_base<int,_std::allocator<int>_>
                               ._M_impl + 4 + (long)pTVar2[iVar12].lastPos * 4) =
                 (pTVar2[iVar12].theSize - pTVar2[iVar12].lastPos) + -2;
            pTVar2[iVar12].lastPos = pTVar2[iVar12].theSize;
            pTVar2[piVar3[uVar11]].theFlg = '\0';
            uVar11 = uVar11 + 1;
          } while (local_220 != uVar11);
        }
      }
      if (this->numfreq != 0) {
        lVar9 = 0;
        uVar11 = 0;
        do {
          TransArray::flushbuf
                    ((TransArray *)
                     ((long)&(((this->extary).
                               super__Vector_base<TransArray,_std::allocator<TransArray>_>._M_impl.
                               super__Vector_impl_data._M_start)->theArray).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl + lVar9),fd,
                     this->args->use_seq,local_230);
          uVar11 = uVar11 + 1;
          lVar9 = lVar9 + 0x48;
        } while (uVar11 < this->numfreq);
      }
      close(fd);
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8);
      }
      local_230 = local_230 + 1;
      pEVar4 = this->args;
    } while (local_230 < pEVar4->num_partitions);
  }
  poVar10 = &this->env->logger;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,"WROTE INVERT ",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void Exttpose::do_invert_db(int pblk, int mincustid, int maxcustid) {
    int numitem = 0, tid = 0, custid = 0; // DD: to avoid gcc warning uninitialized var
    int *buf = nullptr; // DD: to avoid gcc warning uninitialized var
    ostringstream tmpname;
    int fd;
    int i, j, k, idx;

    dcb.get_first_blk();
    dcb.get_next_trans(buf, numitem, tid, custid);
    int ocid;// = -1;
    for (int p = 0; p < args.num_partitions; p++) {
        tmpname << args.output;

        if (args.num_partitions > 1) {
            tmpname << ".P" << p;
        }
        
        string tmpnam = tmpname.str();
        tmpname.str(string());

        if ((fd = open(tmpnam.c_str(), (O_WRONLY | O_CREAT | O_TRUNC | O_BINARY), 0666)) < 0) {
            throw runtime_error("Can't open out file");
        }

        for (i = 0; i < numfreq; i++) {
            extary[i].reset();
        }
        //count 2-itemsets
        int plb = p * pblk + mincustid;
        int pub = plb + pblk;
        if (pub >= maxcustid) pub = maxcustid + 1;
        env.logger << "BOUNDS " << plb << " " << pub << endl;
        int fcnt;
        for (; !dcb.eof() && custid < pub;) {
            fcnt = 0;
            ocid = custid;
            //env.logger << "TID " << custid << " " << tid << " " << numitem << endl;
            while (!dcb.eof() && ocid == custid && custid < pub) {
                //for (k=0; k < numitem; k++){

                // }

                if (args.use_diff) {
                    //add this tid to all items not in the trans
                    k = 0;
                    for (j = 0; j < numitem; j++) {
                        if (freqidx[buf[j]] == -1) continue;

                        while (backidx[k] < buf[j]) {
                            //if ((idx = freqidx[backidx[k]]) != -1){
                            idx = k;
                            if (!args.use_newformat)
                                extary[idx].add(fd, tid, args.use_seq, p);
                            else extary[idx].add(fd, tid, args.use_seq, p, custid);
                            //}
                            k++;
                        }
                        k++; //skip over buf[j]
                    }
                    for (; k < numfreq; k++) {
                        //if ((idx = freqidx[backidx[k]]) != -1){
                        idx = k;
                        if (!args.use_newformat)
                            extary[idx].add(fd, tid, args.use_seq, p);
                        else extary[idx].add(fd, tid, args.use_seq, p, custid);
                        //}
                    }
                } else {
                    // add this tid to all items in the trans
                    for (j = 0; j < numitem; j++) {
                        idx = freqidx[buf[j]];
                        if (idx != -1) {
                            if (!args.use_newformat) {
                                if (args.use_seq && extary[idx].flg() == 0) {
                                    fidx[fcnt] = idx;
                                    fcnt++;
                                    extary[idx].setflg(1);
                                    extary[idx].add(fd, tid, args.use_seq, p, custid);
                                } else {
                                    extary[idx].add(fd, tid, args.use_seq, p);
                                }
                            } else {
                                extary[idx].add(fd, tid, args.use_seq, p, custid);
                            }
                        }
                    }
                }

                dcb.get_next_trans(buf, numitem, tid, custid);
            }
            if (!args.use_newformat && args.use_seq) {
                for (k = 0; k < fcnt; k++) {
                    extary[fidx[k]].setlastpos();
                    extary[fidx[k]].setflg(0);
                }
                fcnt = 0;
            }
        }

        for (i = 0; i < numfreq; i++) {
            //env.logger << "FLUSH " << i << " " << extary[i].lastPos << " " <<
            //   extary[i].theSize << endl;
            extary[i].flushbuf(fd, args.use_seq, p);
        }
        close(fd);
    }
    env.logger << "WROTE INVERT " << endl;
}